

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void __thiscall
Js::JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
          (AutoCatchHandlerExists *this,ScriptContext *scriptContext,bool isPromiseHandled)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContext *pTVar4;
  bool isPromiseHandled_local;
  ScriptContext *scriptContext_local;
  AutoCatchHandlerExists *this_local;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x2d,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pTVar4 = ScriptContext::GetThreadContext(scriptContext);
  this->m_threadContext = pTVar4;
  if (this->m_threadContext == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x2f,"(m_threadContext)","m_threadContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ThreadContext::HasCatchHandler(this->m_threadContext);
  this->m_previousCatchHandlerExists = bVar2;
  ThreadContext::SetHasCatchHandler(this->m_threadContext,true);
  if (!isPromiseHandled) {
    ThreadContext::SetHasCatchHandler(this->m_threadContext,false);
  }
  bVar2 = ThreadContext::IsUserCode(this->m_threadContext);
  this->m_previousCatchHandlerToUserCodeStatus = bVar2;
  bVar2 = ScriptContext::IsScriptContextInDebugMode(scriptContext);
  if (bVar2) {
    FetchNonUserCodeStatus(this,scriptContext);
  }
  return;
}

Assistant:

JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists(ScriptContext* scriptContext, bool isPromiseHandled)
    {
        Assert(scriptContext);
        m_threadContext = scriptContext->GetThreadContext();
        Assert(m_threadContext);
        m_previousCatchHandlerExists = m_threadContext->HasCatchHandler();
        m_threadContext->SetHasCatchHandler(TRUE);

        if (!isPromiseHandled)
        {
            // If this is created from a promise-specific code path, and we don't have a rejection
            // handler on the promise, then we want SetCatchHandler to be false so we report any
            // unhandled exceptions to any detached debuggers.
            m_threadContext->SetHasCatchHandler(false);
        }

        m_previousCatchHandlerToUserCodeStatus = m_threadContext->IsUserCode();
        if (scriptContext->IsScriptContextInDebugMode())
        {
            FetchNonUserCodeStatus(scriptContext);
        }
    }